

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMAttrMapImpl.cpp
# Opt level: O3

bool __thiscall xercesc_4_0::DOMAttrMapImpl::readOnly(DOMAttrMapImpl *this)

{
  long *plVar1;
  long lVar2;
  DOMException *this_00;
  
  if (this->fOwnerNode != (DOMNode *)0x0) {
    plVar1 = (long *)__dynamic_cast(this->fOwnerNode,&DOMNode::typeinfo,&HasDOMNodeImpl::typeinfo,
                                    0xfffffffffffffffe);
    if (plVar1 != (long *)0x0) {
      lVar2 = (**(code **)(*plVar1 + 0x10))(plVar1);
      if (lVar2 != 0) {
        lVar2 = (**(code **)(*plVar1 + 0x10))(plVar1);
        return (*(ushort *)(lVar2 + 0x10) & 1) != 0;
      }
    }
  }
  this_00 = (DOMException *)__cxa_allocate_exception(0x28);
  DOMException::DOMException(this_00,0xb,0,XMLPlatformUtils::fgMemoryManager);
  __cxa_throw(this_00,&DOMException::typeinfo,DOMException::~DOMException);
}

Assistant:

bool DOMAttrMapImpl::readOnly() {
    return castToNodeImpl(fOwnerNode)->isReadOnly();
}